

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcFilterType::IfcFilterType(IfcFilterType *this)

{
  IfcFilterType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1e0,"IfcFilterType");
  Schema_2x3::IfcFlowTreatmentDeviceType::IfcFlowTreatmentDeviceType
            (&this->super_IfcFlowTreatmentDeviceType,&PTR_construction_vtable_24__0105c3b0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFilterType,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFilterType,_1UL> *)
             &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
              field_0x1b0,&PTR_construction_vtable_24__0105c590);
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x105c230;
  *(undefined8 *)&this->field_0x1e0 = 0x105c398;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x105c258;
  (this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x105c280;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x105c2a8;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x105c2d0;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x105c2f8;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x105c320;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x105c348;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.field_0x1b0 =
       0x105c370;
  std::__cxx11::string::string((string *)&(this->super_IfcFlowTreatmentDeviceType).field_0x1c0);
  return;
}

Assistant:

IfcFilterType() : Object("IfcFilterType") {}